

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

int Ptr_ManCountNtk(Vec_Ptr_t *vNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  int local_40;
  int local_3c;
  int Counter;
  int i;
  Vec_Ptr_t *vBox;
  Vec_Ptr_t *vBoxes;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vOutputs;
  Vec_Ptr_t *vInputs;
  Vec_Ptr_t *vNtk_local;
  
  pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  p = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  p_00 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,3);
  p_01 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,4);
  iVar1 = Vec_PtrSize(p_00);
  if (iVar1 != 0) {
    __assert_fail("Vec_PtrSize(vNodes) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x106,"int Ptr_ManCountNtk(Vec_Ptr_t *)");
  }
  iVar1 = Vec_PtrSize(pVVar2);
  local_40 = Vec_PtrSize(p);
  local_40 = local_40 + iVar1;
  for (local_3c = 0; iVar1 = Vec_PtrSize(p_01), local_3c < iVar1; local_3c = local_3c + 1) {
    pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(p_01,local_3c);
    iVar1 = Vec_PtrSize(pVVar2);
    local_40 = iVar1 / 2 + local_40;
  }
  return local_40;
}

Assistant:

int Ptr_ManCountNtk( Vec_Ptr_t * vNtk )
{
    Vec_Ptr_t * vInputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
    Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
    Vec_Ptr_t * vNodes = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3);
    Vec_Ptr_t * vBoxes = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4);
    Vec_Ptr_t * vBox; int i, Counter = 0;
    assert( Vec_PtrSize(vNodes) == 0 );
    Counter += Vec_PtrSize(vInputs);
    Counter += Vec_PtrSize(vOutputs);
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
        Counter += Vec_PtrSize(vBox)/2;
    return Counter;
}